

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

int fmt::v8::detail::format_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  appender out;
  uint uVar1;
  undefined1 uVar2;
  decimal_fp<float> dVar3;
  char *pcVar4;
  buffer<char> *in_RDX;
  undefined8 in_RSI;
  int in_EDI;
  bool bVar5;
  decimal_fp<double> dVar6;
  undefined8 unaff_retaddr;
  undefined2 in_stack_00000008;
  undefined8 in_stack_0000000a;
  float_specs in_stack_0000001c;
  size_t num_digits;
  int max_double_digits;
  bool is_predecessor_closer;
  fp f;
  bool use_dragon;
  int exp;
  decimal_fp<double> dec;
  decimal_fp<float> dec_1;
  bool fixed;
  int *in_stack_000002c0;
  buffer<char> *in_stack_000002c8;
  int in_stack_000002d0;
  undefined1 in_stack_000002d7;
  fp in_stack_000002d8;
  undefined4 in_stack_ffffffffffffff08;
  char value_00;
  int in_stack_ffffffffffffff0c;
  undefined2 in_stack_ffffffffffffff10;
  undefined6 in_stack_ffffffffffffff12;
  undefined2 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1a;
  undefined1 in_stack_ffffffffffffff1e;
  undefined1 in_stack_ffffffffffffff1f;
  buffer<char> *in_stack_ffffffffffffff20;
  buffer<char> *this;
  undefined8 in_stack_ffffffffffffff38;
  float n;
  undefined4 in_stack_ffffffffffffff40;
  size_t local_b8;
  float in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  unsigned_long in_stack_ffffffffffffff80;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  bool local_39;
  buffer<char> *local_38;
  int local_2c;
  longdouble local_28;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar7;
  uint uStack_8;
  int in_stack_fffffffffffffffc;
  int iVar8;
  
  n = (float)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  local_28 = (longdouble)CONCAT82(in_stack_0000000a,in_stack_00000008);
  uVar7 = (undefined4)in_RSI;
  uStack_8 = (uint)((ulong)in_RSI >> 0x20);
  uVar1 = uStack_8;
  local_39 = (longdouble)0 <= local_28;
  local_38 = in_RDX;
  local_2c = in_EDI;
  ignore_unused<bool,char[18]>(&local_39,(char (*) [18])"value is negative");
  uStack_8._0_1_ = (char)((ulong)in_RSI >> 0x20);
  if ((longdouble)0 < local_28) {
    if ((uVar1 >> 0x13 & 1) == 0) {
      if (local_2c < 0) {
        if ((uVar1 >> 0x12 & 1) == 0) {
          dVar6 = dragonbox::to_decimal<double>
                            ((double)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
          iVar8 = dVar6.exponent;
          appender::back_insert_iterator
                    ((appender *)CONCAT62(in_stack_ffffffffffffff12,in_stack_ffffffffffffff10),
                     (buffer<char> *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
          write<char,_fmt::v8::appender,_unsigned_long,_0>
                    ((appender)in_stack_ffffffffffffff88.container,in_stack_ffffffffffffff80);
        }
        else {
          dVar3 = dragonbox::to_decimal<float>(in_stack_ffffffffffffff74);
          iVar8 = dVar3.exponent;
          appender::back_insert_iterator
                    ((appender *)CONCAT62(in_stack_ffffffffffffff12,in_stack_ffffffffffffff10),
                     (buffer<char> *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
          out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._4_4_ =
               in_stack_ffffffffffffff7c;
          out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._0_4_ =
               in_stack_ffffffffffffff78;
          write<char,_fmt::v8::appender,_unsigned_int,_0>(out,(uint)in_stack_ffffffffffffff74);
        }
      }
      else {
        iVar8 = 0;
        fp::fp((fp *)&stack0xffffffffffffff68);
        if ((uVar1 >> 0x12 & 1) == 0) {
          uVar2 = fp::assign<long_double,_0>
                            ((fp *)in_stack_ffffffffffffff20,
                             (longdouble)
                             CONCAT28(in_stack_ffffffffffffff18,
                                      CONCAT62(in_stack_ffffffffffffff12,
                                               (short)((unkuint10)local_28 >> 0x40))));
        }
        else {
          uVar2 = fp::assign<float,_0>((fp *)CONCAT44((float)local_28,in_stack_ffffffffffffff40),n);
        }
        if (0x2ff < local_2c) {
          local_2c = 0x2ff;
        }
        format_dragon(in_stack_000002d8,(bool)in_stack_000002d7,in_stack_000002d0,in_stack_000002c8,
                      in_stack_000002c0);
        if (((char)uStack_8 != '\x02') && ((uVar1 >> 0x14 & 1) == 0)) {
          local_b8 = buffer<char>::size(local_38);
          while( true ) {
            bVar5 = false;
            if (local_b8 != 0) {
              pcVar4 = buffer<char>::operator[]<unsigned_long>(local_38,local_b8 - 1);
              bVar5 = *pcVar4 == '0';
            }
            if (!bVar5) break;
            local_b8 = local_b8 - 1;
            iVar8 = iVar8 + 1;
          }
          buffer<char>::try_resize
                    (in_stack_ffffffffffffff20,
                     CONCAT17(uVar2,(uint7)CONCAT42(in_stack_ffffffffffffff1a,
                                                    in_stack_ffffffffffffff18)));
        }
      }
    }
    else {
      iVar8 = snprintf_float<long_double>
                        ((longdouble)CONCAT28(in_stack_00000008,unaff_retaddr),
                         in_stack_fffffffffffffffc,in_stack_0000001c,
                         (buffer<char> *)CONCAT44(uVar7,in_stack_fffffffffffffff0));
    }
  }
  else if ((local_2c < 1) || ((char)uStack_8 != '\x02')) {
    buffer<char>::push_back
              ((buffer<char> *)CONCAT62(in_stack_ffffffffffffff12,in_stack_ffffffffffffff10),
               (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    iVar8 = 0;
  }
  else {
    this = local_38;
    to_unsigned<int>(0);
    value_00 = (char)((uint)in_stack_ffffffffffffff08 >> 0x18);
    buffer<char>::try_resize
              (this,CONCAT17(in_stack_ffffffffffffff1f,
                             CONCAT16(in_stack_ffffffffffffff1e,
                                      CONCAT42(in_stack_ffffffffffffff1a,in_stack_ffffffffffffff18))
                            ));
    buffer<char>::data(local_38);
    fill_n<char,int>((char *)CONCAT62(in_stack_ffffffffffffff12,in_stack_ffffffffffffff10),
                     in_stack_ffffffffffffff0c,value_00);
    iVar8 = -local_2c;
  }
  return iVar8;
}

Assistant:

FMT_HEADER_ONLY_CONSTEXPR20 int format_float(Float value, int precision,
                                             float_specs specs,
                                             buffer<char>& buf) {
  // float is passed as double to reduce the number of instantiations.
  static_assert(!std::is_same<Float, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (specs.fallback) return snprintf_float(value, precision, specs, buf);

  if (!is_constant_evaluated() && precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  }

  int exp = 0;
  bool use_dragon = true;
  if (is_fast_float<Float>()) {
    // Use Grisu + Dragon4 for the given precision:
    // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
    const int min_exp = -60;  // alpha in Grisu.
    int cached_exp10 = 0;     // K in Grisu.
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::num_significand_bits), cached_exp10);
    normalized = normalized * cached_pow;
    gen_digits_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) != digits::error &&
        !is_constant_evaluated()) {
      exp += handler.exp10;
      buf.try_resize(to_unsigned(handler.size));
      use_dragon = false;
    } else {
      exp += handler.size - cached_exp10 - 1;
      precision = handler.precision;
    }
  }
  if (use_dragon) {
    auto f = fp();
    bool is_predecessor_closer =
        specs.binary32 ? f.assign(static_cast<float>(value)) : f.assign(value);
    // Limit precision to the maximum possible number of significant digits in
    // an IEEE754 double because we don't need to generate zeros.
    const int max_double_digits = 767;
    if (precision > max_double_digits) precision = max_double_digits;
    format_dragon(f, is_predecessor_closer, precision, buf, exp);
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}